

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_getColName(void *highs,HighsInt col,char *name)

{
  HighsStatus HVar1;
  string name_v;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  HVar1 = Highs::getColName((Highs *)highs,col,&local_38);
  strcpy(name,local_38._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_38);
  return HVar1;
}

Assistant:

HighsInt Highs_getColName(const void* highs, const HighsInt col, char* name) {
  std::string name_v;
  HighsInt retcode = (HighsInt)((Highs*)highs)->getColName(col, name_v);
  strcpy(name, name_v.c_str());
  return retcode;
}